

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conditionalestimator.cxx
# Opt level: O2

void __thiscall
ConditionalEstimator::ConditionalEstimator
          (ConditionalEstimator *this,Property *property,StochasticProcess *stochvar,
          StochasticProcess *condition,Time *time,int pre,int post,int updateCorrection)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  double *pdVar4;
  double **ppdVar5;
  ulong uVar6;
  uint l;
  ulong uVar7;
  long lVar8;
  allocator<char> local_92;
  allocator<char> local_91;
  Ring<double> *local_90;
  Ring<bool> *local_88;
  Ring<double> *local_80;
  StochasticProcess *local_78;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_91);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"Estimator",&local_92);
  local_78 = condition;
  Estimator::Estimator(&this->super_Estimator,stochvar,time,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_Estimator).super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__ConditionalEstimator_001547a8;
  l = post + pre + 1;
  Ring<double>::Ring(&this->condSampleRing,l);
  local_88 = &this->condEventRing;
  local_80 = &this->condSampleRing;
  Ring<bool>::Ring(local_88,0);
  local_90 = &this->condConditionRing;
  Ring<double>::Ring(local_90,l);
  iVar1 = post + pre;
  uVar2 = *property;
  (this->super_Estimator).nEstimate = uVar2;
  (this->super_Estimator).pSource = stochvar;
  this->condTrigger = (StochasticEventGenerator *)0x0;
  this->condCondition = local_78;
  (this->super_Estimator).nSamples = 0;
  this->condSamples = (double *)0x0;
  this->aOne = (double *)0x0;
  this->nDist = 0;
  this->aTwo = (double *)0x0;
  this->aThree = (double *)0x0;
  this->aEvents = (double *)0x0;
  this->aDist = (double **)0x0;
  this->nPre = pre;
  this->nPost = post;
  this->nUpdateCorrection = updateCorrection;
  uVar7 = (ulong)l;
  uVar3 = 0xffffffffffffffff;
  if ((uVar2 & 1) != 0) {
    uVar6 = uVar7 * 8;
    if (iVar1 < -1) {
      uVar6 = uVar3;
    }
    pdVar4 = (double *)operator_new__(uVar6);
    this->condSamples = pdVar4;
  }
  if ((uVar2 & 4) != 0) {
    uVar6 = uVar7 * 8;
    if (iVar1 < -1) {
      uVar6 = uVar3;
    }
    pdVar4 = (double *)operator_new__(uVar6);
    this->aOne = pdVar4;
  }
  if ((uVar2 & 0x20) != 0) {
    uVar6 = uVar7 * 8;
    if (iVar1 < -1) {
      uVar6 = uVar3;
    }
    pdVar4 = (double *)operator_new__(uVar6);
    this->aEvents = pdVar4;
  }
  if ((uVar2 & 8) != 0) {
    uVar6 = uVar7 * 8;
    if (iVar1 < -1) {
      uVar6 = uVar3;
    }
    pdVar4 = (double *)operator_new__(uVar6);
    this->aTwo = pdVar4;
  }
  if ((uVar2 & 0x10) != 0) {
    uVar6 = uVar7 * 8;
    if (iVar1 < -1) {
      uVar6 = uVar3;
    }
    pdVar4 = (double *)operator_new__(uVar6);
    this->aThree = pdVar4;
  }
  if ((uVar2 & 2) != 0) {
    this->nDist = 100;
    uVar7 = uVar7 << 3;
    if (iVar1 < -1) {
      uVar7 = uVar3;
    }
    ppdVar5 = (double **)operator_new__(uVar7);
    this->aDist = ppdVar5;
    for (lVar8 = 0; lVar8 <= iVar1; lVar8 = lVar8 + 1) {
      pdVar4 = (double *)operator_new__(800);
      this->aDist[lVar8] = pdVar4;
    }
    this->aDistRange[0] = -5.0;
    this->aDistRange[1] = 65.0;
    *(undefined4 *)&this->dDistOffset = 0;
    *(undefined4 *)((long)&this->dDistOffset + 4) = 0xc0140000;
    *(undefined4 *)&this->dDistScale = 0x66666666;
    *(undefined4 *)((long)&this->dDistScale + 4) = 0x3fe66666;
  }
  (*(this->super_Estimator).super_Parametric._vptr_Parametric[4])(this);
  return;
}

Assistant:

ConditionalEstimator::ConditionalEstimator(const Property& property, StochasticProcess *stochvar, StochasticProcess *condition, Time *time,  int pre, int post, int updateCorrection)
	: Estimator(stochvar, time), condSampleRing(pre+post+1), condEventRing(0), condConditionRing(pre+post+1)
{
	nEstimate = property;
	pSource = stochvar;
	condTrigger = 0;
	condCondition = condition;
	nSamples = 0;
	aDist = 0;
	nDist = 0;
	condSamples = 0;
	aOne = 0;
	aTwo = 0;
	aThree = 0;
	aEvents = 0;
	nPre = pre;
	nPost = post;
	nUpdateCorrection = updateCorrection;
	if(nEstimate & EST_SAMPLE)
		condSamples = new double[pre+post+1];
	if(nEstimate & EST_MEAN)
		aOne = new double[pre+post+1];
	if(nEstimate & EST_EVENTS)
		aEvents = new double[pre+post+1];
	if(nEstimate & EST_VAR)
		aTwo = new double[pre+post+1];
	if(nEstimate & EST_CUR)
		aThree = new double[pre+post+1];
	if(nEstimate & EST_DENS) {
		nDist = 100;
		aDist = new double *[pre+post+1];
		for( int i=0; i<pre+post+1; i++ )
			aDist[i] = new double[nDist];
		aDistRange[0] = -5.0;
		aDistRange[1] = 65.0;
		dDistOffset = double(aDistRange[0]);
		dDistScale = (double(aDistRange[1]) - double(aDistRange[0])) / double(nDist);
	}
	init();
}